

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O1

bool DoSearch<DNA>(string *queryPath,string *databasePath,string *outputPath,
                  SearchParams<DNA> *searchParams)

{
  size_t *psVar1;
  _Invoker_type *__args;
  _Map_pointer *pppSVar2;
  _Any_data *p_Var3;
  _Map_pointer *out;
  char cVar4;
  size_t sVar5;
  size_t sVar6;
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  local_568 [8];
  QueryDatabaseSearcher<DNA> searcher;
  Database<DNA> db;
  Sequence<DNA> seq;
  SequenceList<DNA> sequences;
  SearchResultsWriter<DNA> writer;
  SequenceList<DNA> queries;
  undefined1 local_78 [8];
  ProgressOutput progress;
  unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_> dbReader;
  unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_> qryReader;
  
  progress.mStages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&progress.mStages;
  local_78._0_4_ = -1;
  progress.mStages._M_t._M_impl._0_4_ = 0;
  progress.mStages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  progress.mStages._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  progress.mStages._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  progress.mStages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       progress.mStages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  Sequence<DNA>::Sequence((Sequence<DNA> *)&db.mProgressCallback._M_invoker);
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  seq.sequence.field_2._8_8_ = 0;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::_M_initialize_map
            ((_Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)
             ((long)&seq.sequence.field_2 + 8),0);
  DetectFileFormatAndOpenReader<DNA>
            ((string *)&progress.mStages._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (FileFormat)databasePath);
  psVar1 = &writer.mWorkers.super__Deque_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Deque_impl_data._M_map_size;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,"Read database","");
  ProgressOutput::Add((ProgressOutput *)local_78,0,
                      (string *)
                      &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node,BYTES);
  if (sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node != (_Map_pointer)psVar1) {
    operator_delete(sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,"Analyze database","");
  ProgressOutput::Add((ProgressOutput *)local_78,1,
                      (string *)
                      &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node,COUNTS);
  if (sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node != (_Map_pointer)psVar1) {
    operator_delete(sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,"Index database","");
  ProgressOutput::Add((ProgressOutput *)local_78,2,
                      (string *)
                      &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node,COUNTS);
  if (sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node != (_Map_pointer)psVar1) {
    operator_delete(sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,"Read queries","");
  ProgressOutput::Add((ProgressOutput *)local_78,3,
                      (string *)
                      &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node,BYTES);
  if (sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node != (_Map_pointer)psVar1) {
    operator_delete(sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,"Search database","");
  ProgressOutput::Add((ProgressOutput *)local_78,4,
                      (string *)
                      &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node,COUNTS);
  if (sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node != (_Map_pointer)psVar1) {
    operator_delete(sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,"Write hits","");
  ProgressOutput::Add((ProgressOutput *)local_78,5,
                      (string *)
                      &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node,COUNTS);
  if (sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node != (_Map_pointer)psVar1) {
    operator_delete(sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  ProgressOutput::Activate((ProgressOutput *)local_78,0);
  __args = &db.mProgressCallback._M_invoker;
  while (cVar4 = (**(code **)(**(long **)(progress.mStages._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 8) + 0x10))(), cVar4 == '\0') {
    (*(code *)**(undefined8 **)progress.mStages._M_t._M_impl.super__Rb_tree_header._M_node_count)
              (progress.mStages._M_t._M_impl.super__Rb_tree_header._M_node_count,__args);
    std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>::emplace_back<Sequence<DNA>>
              ((deque<Sequence<DNA>,std::allocator<Sequence<DNA>>> *)
               (seq.sequence.field_2._M_local_buf + 8),(Sequence<DNA> *)__args);
    sVar5 = (**(code **)**(undefined8 **)
                          (progress.mStages._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))()
    ;
    sVar6 = (**(code **)(**(long **)(progress.mStages._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count + 8) + 8))();
    ProgressOutput::Set((ProgressOutput *)local_78,0,sVar5,sVar6);
  }
  Database<DNA>::Database
            ((Database<DNA> *)
             &searcher.mProcessedCallbacks.
              super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,8);
  writer.mWorkers.super__Deque_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  writer.mWorkers.super__Deque_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       std::
       _Function_handler<void_(Database<DNA>::ProgressType,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/src/Search.cpp:147:5)>
       ::_M_invoke;
  writer.mWorkers.super__Deque_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Deque_impl_data._M_map_size =
       (size_t)std::
               _Function_handler<void_(Database<DNA>::ProgressType,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/src/Search.cpp:147:5)>
               ::_M_manager;
  sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_78;
  std::function<void_(Database<DNA>::ProgressType,_unsigned_long,_unsigned_long)>::operator=
            ((function<void_(Database<DNA>::ProgressType,_unsigned_long,_unsigned_long)> *)
             &db.mKmers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (function<void_(Database<DNA>::ProgressType,_unsigned_long,_unsigned_long)> *)
             &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  if (writer.mWorkers.super__Deque_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Deque_impl_data._M_map_size != 0) {
    pppSVar2 = &sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
    (*(code *)writer.mWorkers.super__Deque_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Deque_impl_data._M_map_size)(pppSVar2,pppSVar2,3);
  }
  Database<DNA>::Initialize
            ((Database<DNA> *)
             &searcher.mProcessedCallbacks.
              super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (SequenceList<DNA> *)((long)&seq.sequence.field_2 + 8));
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::WorkerQueue((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node,1,outputPath);
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  ::WorkerQueue(local_568,-1,
                (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node,
                (Database<DNA> *)
                &searcher.mProcessedCallbacks.
                 super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,searchParams);
  writer.mProcessedCallbacks.
  super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_78;
  std::
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::push_back((deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
               *)&searcher.mTotalProcessed,
              (value_type *)
              &writer.mProcessedCallbacks.
               super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  p_Var3 = (_Any_data *)
           &writer.mProcessedCallbacks.
            super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  _Function_handler<void_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/src/Search.cpp:171:25)>
  ::_M_manager(p_Var3,p_Var3,__destroy_functor);
  writer.mProcessedCallbacks.
  super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_78;
  std::
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::push_back((deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
               *)&writer.mTotalProcessed,
              (value_type *)
              &writer.mProcessedCallbacks.
               super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  p_Var3 = (_Any_data *)
           &writer.mProcessedCallbacks.
            super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  _Function_handler<void_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/src/Search.cpp:174:23)>
  ::_M_manager(p_Var3,p_Var3,__destroy_functor);
  DetectFileFormatAndOpenReader<DNA>((string *)&dbReader,(FileFormat)queryPath);
  writer.mProcessedCallbacks.
  super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::_M_initialize_map
            ((_Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)
             &writer.mProcessedCallbacks.
              super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  ProgressOutput::Activate((ProgressOutput *)local_78,3);
  out = &writer.mProcessedCallbacks.
         super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
  while (cVar4 = (**(code **)(**(long **)((long)dbReader._M_t.
                                                super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>
                                                .super__Head_base<0UL,_SequenceReader<DNA>_*,_false>
                                                ._M_head_impl + 8) + 0x10))(), cVar4 == '\0') {
    SequenceReader<DNA>::Read
              ((SequenceReader<DNA> *)
               dbReader._M_t.
               super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>
               .super__Head_base<0UL,_SequenceReader<DNA>_*,_false>._M_head_impl,0x40,
               (SequenceList<DNA> *)out);
    WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
    ::Enqueue(local_568,(deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)out);
    sVar5 = (**(code **)**(undefined8 **)
                          ((long)dbReader._M_t.
                                 super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>
                                 .super__Head_base<0UL,_SequenceReader<DNA>_*,_false>._M_head_impl +
                          8))();
    sVar6 = (**(code **)(**(long **)((long)dbReader._M_t.
                                           super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>
                                           .super__Head_base<0UL,_SequenceReader<DNA>_*,_false>.
                                           _M_head_impl + 8) + 8))();
    ProgressOutput::Set((ProgressOutput *)local_78,3,sVar5,sVar6);
  }
  ProgressOutput::Activate((ProgressOutput *)local_78,4);
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  ::WaitTillDone(local_568);
  ProgressOutput::Activate((ProgressOutput *)local_78,5);
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::WaitTillDone((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_node);
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::~deque
            ((deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)
             &writer.mProcessedCallbacks.
              super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  if ((__uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>)
      dbReader._M_t.
      super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>._M_t.
      super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>.
      super__Head_base<0UL,_SequenceReader<DNA>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>)0x0) {
    (**(code **)(*(long *)dbReader._M_t.
                          super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>
                          .super__Head_base<0UL,_SequenceReader<DNA>_*,_false>._M_head_impl + 0x10))
              (dbReader._M_t.
               super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>
               .super__Head_base<0UL,_SequenceReader<DNA>_*,_false>._M_head_impl);
  }
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  ::~WorkerQueue(local_568);
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~WorkerQueue((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&sequences.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_node);
  Database<DNA>::~Database
            ((Database<DNA> *)
             &searcher.mProcessedCallbacks.
              super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  if (progress.mStages._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    (**(code **)(*(long *)progress.mStages._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10))
              (progress.mStages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::~deque
            ((deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)
             ((long)&seq.sequence.field_2 + 8));
  if ((size_type *)seq.quality.field_2._8_8_ != &seq.sequence._M_string_length) {
    operator_delete((void *)seq.quality.field_2._8_8_);
  }
  if ((size_type *)seq.identifier.field_2._8_8_ != &seq.quality._M_string_length) {
    operator_delete((void *)seq.identifier.field_2._8_8_);
  }
  if (db.mProgressCallback._M_invoker != (_Invoker_type)&seq.identifier._M_string_length) {
    operator_delete(db.mProgressCallback._M_invoker);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_ProgressOutput::Stage>,_std::_Select1st<std::pair<const_int,_ProgressOutput::Stage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ProgressOutput::Stage>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_ProgressOutput::Stage>,_std::_Select1st<std::pair<const_int,_ProgressOutput::Stage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ProgressOutput::Stage>_>_>
               *)&progress);
  return true;
}

Assistant:

bool DoSearch( const std::string& queryPath, const std::string& databasePath,
               const std::string&       outputPath,
               const SearchParams< A >& searchParams ) {
  ProgressOutput progress;

  Sequence< A >     seq;
  SequenceList< A > sequences;

  auto dbReader = DetectFileFormatAndOpenReader< A >( databasePath, FileFormat::FASTA );

  enum ProgressType {
    ReadDBFile,
    StatsDB,
    IndexDB,
    ReadQueryFile,
    SearchDB,
    WriteHits
  };

  progress.Add( ProgressType::ReadDBFile, "Read database", UnitType::BYTES );
  progress.Add( ProgressType::StatsDB, "Analyze database" );
  progress.Add( ProgressType::IndexDB, "Index database" );
  progress.Add( ProgressType::ReadQueryFile, "Read queries", UnitType::BYTES );
  progress.Add( ProgressType::SearchDB, "Search database" );
  progress.Add( ProgressType::WriteHits, "Write hits" );

  // Read DB
  progress.Activate( ProgressType::ReadDBFile );
  while( !dbReader->EndOfFile() ) {
    (*dbReader) >> seq;
    sequences.push_back( std::move( seq ) );
    progress.Set( ProgressType::ReadDBFile, dbReader->NumBytesRead(),
                  dbReader->NumBytesTotal() );
  }

  // Index DB
  Database< A > db( WordSize< A >::VALUE );
  db.SetProgressCallback(
    [&]( typename Database< A >::ProgressType type, size_t num, size_t total ) {
      switch( type ) {
        case Database< A >::ProgressType::StatsCollection:
          progress.Activate( ProgressType::StatsDB )
            .Set( ProgressType::StatsDB, num, total );
          break;

        case Database< A >::ProgressType::Indexing:
          progress.Activate( ProgressType::IndexDB )
            .Set( ProgressType::IndexDB, num, total );
          break;

        default:
          break;
      }
    } );
  db.Initialize( sequences );

  // Read and process queries
  const int numQueriesPerWorkItem = 64;

  SearchResultsWriter< A >   writer( 1, outputPath );
  QueryDatabaseSearcher< A > searcher( -1, &writer, &db, searchParams );

  searcher.OnProcessed( [&]( size_t numProcessed, size_t numEnqueued ) {
    progress.Set( ProgressType::SearchDB, numProcessed, numEnqueued );
  } );
  writer.OnProcessed( [&]( size_t numProcessed, size_t numEnqueued ) {
    progress.Set( ProgressType::WriteHits, numProcessed, numEnqueued );
  } );

  auto qryReader = DetectFileFormatAndOpenReader< A >( queryPath, FileFormat::FASTA );

  SequenceList< A > queries;
  progress.Activate( ProgressType::ReadQueryFile );
  while( !qryReader->EndOfFile() ) {
    qryReader->Read( numQueriesPerWorkItem, &queries );
    searcher.Enqueue( queries );
    progress.Set( ProgressType::ReadQueryFile, qryReader->NumBytesRead(),
                  qryReader->NumBytesTotal() );
  }

  // Search
  progress.Activate( ProgressType::SearchDB );
  searcher.WaitTillDone();

  progress.Activate( ProgressType::WriteHits );
  writer.WaitTillDone();

  return true;
}